

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImDrawList *pIVar2;
  _Bool _Var3;
  char *pcVar4;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  bool local_c1;
  float local_c0;
  float local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  float local_a4;
  float border_y;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  float local_80;
  float fStack_7c;
  ImU32 outer_col;
  ImRect outer_border;
  ImVec2 local_64;
  float local_5c;
  float local_58;
  float draw_y2;
  ImU32 col;
  bool is_frozen_separator;
  bool is_resizable;
  bool is_resized;
  bool is_hovered;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float draw_y2_head;
  float draw_y2_body;
  float draw_y1;
  float border_size;
  ImVec2 local_28;
  ImDrawList *local_20;
  ImDrawList *inner_drawlist;
  ImGuiWindow *inner_window;
  ImGuiTable *table_local;
  
  inner_drawlist = (ImDrawList *)table->InnerWindow;
  inner_window = (ImGuiWindow *)table;
  _Var3 = ImRect::Overlaps(&table->OuterWindow->ClipRect,&table->OuterRect);
  if (_Var3) {
    local_20 = (ImDrawList *)inner_drawlist[3]._IdxWritePtr;
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)(inner_window->DC).StateStorage,local_20,0);
    local_28 = *(ImVec2 *)&(inner_window->DC).PrevLineSize.y;
    draw_y1 = (inner_window->DC).PrevLineTextBaseOffset;
    unique0x00012004 = (inner_window->DC).Indent.x;
    ImDrawList::PushClipRect(local_20,local_28,_draw_y1,false);
    draw_y2_body = 1.0;
    local_c0 = *(float *)&(inner_window->IDStack).Data;
    order_n = (int)(inner_window->DC).CursorPos.x;
    draw_y2_head = local_c0;
    if (((uint)(inner_window->OuterRectClipped).Max.y & 0x100) != 0) {
      if (*(char *)((long)&(inner_window->OuterRectClipped).Min.x + 2) < '\x01') {
        local_bc = (inner_window->DC).CursorPosPrevLine.x;
      }
      else {
        local_bc = *(float *)&(inner_window->IDStack).Data;
      }
      local_c0 = ImMin<float>((inner_window->DC).CursorPos.x,
                              local_bc + *(float *)&inner_window->FocusOrder);
    }
    column_n = (int)local_c0;
    if (((ulong)inner_window->Name & 0x20000000000) != 0) {
      for (column._4_4_ = 0; column._4_4_ < (int)(inner_window->ContentSizeExplicit).y;
          column._4_4_ = column._4_4_ + 1) {
        if (((ulong)inner_window->Pos & 1L << ((byte)column._4_4_ & 0x3f)) != 0) {
          pcVar4 = ImSpan<signed_char>::operator[]
                             ((ImSpan<signed_char> *)
                              &(inner_window->WindowClass).DockNodeFlagsOverrideSet,column._4_4_);
          column._0_4_ = (int)*pcVar4;
          _col = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)
                            &(inner_window->WindowClass).ParentViewportId,(int)column);
          draw_y2._3_1_ =
               *(char *)((long)&(inner_window->DC).TextWrapPosStack.Capacity + 1) == (int)column;
          local_c1 = false;
          if (*(char *)((long)&(inner_window->DC).TextWrapPosStack.Capacity + 3) == (int)column) {
            local_c1 = *(short *)((long)&inner_window->WindowRounding + 2) ==
                       *(short *)&inner_window->WindowRounding;
          }
          draw_y2._2_1_ = local_c1;
          draw_y2._1_1_ = (_col->Flags & 0x40000020U) == 0;
          draw_y2._0_1_ = (int)*(char *)&(inner_window->OuterRectClipped).Min.y == column._4_4_ + 1;
          pfVar1 = &(inner_window->DC).CursorMaxPos.y;
          if ((((_col->MaxX < *pfVar1 || _col->MaxX == *pfVar1) || (local_c1 != false)) &&
              (((_col->NextEnabledColumn != -1 || ((bool)draw_y2._1_1_)) ||
               ((((ulong)inner_window->Name & 0xe00000000000) == 0x400000000000 &&
                (((ulong)inner_window->Name & 0x1000000000000) == 0)))))) &&
             ((_col->ClipRect).Min.x < _col->MaxX)) {
            if ((((bool)draw_y2._3_1_) || (local_c1 != false)) || ((bool)draw_y2._0_1_)) {
              local_5c = (float)order_n;
              if (local_c1 == false) {
                if ((bool)draw_y2._3_1_) {
                  local_cc = (float)GetColorU32(0x1c,1.0);
                }
                else {
                  local_cc = (inner_window->ScrollTarget).y;
                }
                local_c8 = local_cc;
              }
              else {
                local_c8 = (float)GetColorU32(0x1d,1.0);
              }
              local_58 = local_c8;
            }
            else {
              if (((ulong)inner_window->Name & 0x180000000000) == 0) {
                local_d0 = (float)order_n;
              }
              else {
                local_d0 = (float)column_n;
              }
              local_5c = local_d0;
              if (((ulong)inner_window->Name & 0x180000000000) == 0) {
                local_d4 = (inner_window->ScrollTargetCenterRatio).x;
              }
              else {
                local_d4 = (inner_window->ScrollTarget).y;
              }
              local_58 = local_d4;
            }
            pIVar2 = local_20;
            if (draw_y2_head < local_5c) {
              ImVec2::ImVec2(&local_64,_col->MaxX,draw_y2_head);
              ImVec2::ImVec2(&outer_border.Max,_col->MaxX,local_5c);
              ImDrawList::AddLine(pIVar2,&local_64,&outer_border.Max,(ImU32)local_58,1.0);
            }
          }
        }
      }
    }
    pIVar2 = local_20;
    if (((ulong)inner_window->Name & 0x50000000000) != 0) {
      _fStack_7c = *(ImVec2 *)&(inner_window->SetWindowPosVal).y;
      outer_border.Min = *(ImVec2 *)&(inner_window->SetWindowPosPivot).y;
      local_80 = (inner_window->ScrollTarget).y;
      if (((ulong)inner_window->Name & 0x50000000000) == 0x50000000000) {
        ImDrawList::AddRect(local_20,(ImVec2 *)&stack0xffffffffffffff84,&outer_border.Min,
                            (ImU32)local_80,0.0,0,1.0);
      }
      else if (((ulong)inner_window->Name & 0x40000000000) == 0) {
        if (((ulong)inner_window->Name & 0x10000000000) != 0) {
          ImVec2::ImVec2(&local_98,outer_border.Min.x,(float)outer_col);
          ImDrawList::AddLine(pIVar2,(ImVec2 *)&stack0xffffffffffffff84,&local_98,(ImU32)local_80,
                              1.0);
          pIVar2 = local_20;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,fStack_7c,outer_border.Min.y);
          ImDrawList::AddLine(pIVar2,(ImVec2 *)&stack0xffffffffffffff60,&outer_border.Min,
                              (ImU32)local_80,1.0);
        }
      }
      else {
        ImVec2::ImVec2(&local_88,fStack_7c,outer_border.Min.y);
        ImDrawList::AddLine(pIVar2,(ImVec2 *)&stack0xffffffffffffff84,&local_88,(ImU32)local_80,1.0)
        ;
        pIVar2 = local_20;
        ImVec2::ImVec2(&local_90,outer_border.Min.x,(float)outer_col);
        ImDrawList::AddLine(pIVar2,&local_90,&outer_border.Min,(ImU32)local_80,1.0);
      }
    }
    pIVar2 = local_20;
    if (((((ulong)inner_window->Name & 0x8000000000) != 0) &&
        ((float)inner_window->NameBufLen < (float)(inner_window->IDStack).Size)) &&
       ((local_a4 = (float)inner_window->NameBufLen, (inner_window->DC).CurrLineSize.x <= local_a4
        && (local_a4 < (inner_window->DC).PrevLineSize.x)))) {
      ImVec2::ImVec2(&local_ac,(inner_window->ScrollTargetCenterRatio).y,local_a4);
      ImVec2::ImVec2(&local_b4,(inner_window->ScrollTargetEdgeSnapDist).x,local_a4);
      ImDrawList::AddLine(pIVar2,&local_ac,&local_b4,
                          (ImU32)(inner_window->ScrollTargetCenterRatio).x,1.0);
    }
    ImDrawList::PopClipRect(local_20);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}